

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O3

void test_write_format_zip_large(void)

{
  fileblock *pfVar1;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  fileblocks *fileblocks;
  archive *paVar5;
  archive_entry *paVar6;
  ssize_t sVar7;
  void *pvVar8;
  size_t __n;
  fileblock *b;
  size_t s;
  ulong s_00;
  ulong uVar9;
  longlong v1;
  fileblocks *private;
  char namebuff [64];
  void *local_88;
  ulong local_80;
  char local_78 [72];
  
  fileblocks = (fileblocks *)calloc(1,0x38);
  nullsize = 1;
  nulldata = malloc(0x100000);
  memset(nulldata,0xaa,0x100000);
  paVar5 = archive_write_new();
  archive_write_set_format_zip(paVar5);
  iVar3 = archive_write_set_options(paVar5,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ŏ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:compression=store\")",paVar5);
  iVar3 = archive_write_set_options(paVar5,"zip:fakecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ő',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:fakecrc32\")",paVar5);
  iVar3 = archive_write_set_bytes_per_block(paVar5,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Œ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 0)",
                      paVar5);
  iVar3 = archive_write_open(paVar5,fileblocks,(undefined1 *)0x0,memory_write,(undefined1 *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open(a, fileblocks, NULL, memory_write, NULL)",paVar5);
  uVar9 = 0;
  do {
    paVar6 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                     ,L'Ś',(uint)(paVar6 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    sprintf(local_78,"file_%d",uVar9 & 0xffffffff);
    archive_entry_copy_pathname(paVar6,local_78);
    archive_entry_set_mode(paVar6,0x81ed);
    s_00 = test_sizes[uVar9];
    local_80 = uVar9;
    archive_entry_set_size(paVar6,s_00);
    iVar3 = archive_write_header(paVar5,paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'Ţ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(paVar6);
    do {
      s = 0x100000;
      if (s_00 < 0x100000) {
        s = s_00;
      }
      sVar7 = archive_write_data(paVar5,nulldata,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                          ,L'ŭ',s,"(int)writesize",(long)(int)sVar7,
                          "(int)archive_write_data(a, nulldata, writesize)",paVar5);
      uVar9 = s_00 - s;
      bVar2 = (long)s <= (long)s_00;
      s_00 = uVar9;
    } while (uVar9 != 0 && bVar2);
    uVar9 = local_80 + 1;
  } while (uVar9 != 0x10);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ų',(uint)(paVar6 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar6,"lastfile");
  archive_entry_set_mode(paVar6,0x81ed);
  iVar3 = archive_write_header(paVar5,paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ŵ',(uint)(iVar3 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(paVar6);
  iVar3 = archive_write_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ź',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar5);
  iVar3 = archive_write_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ź',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar5 = archive_read_new();
  wVar4 = archive_read_support_format_zip_seekable(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɓ',0,"ARCHIVE_OK",(long)wVar4,
                      "archive_read_support_format_zip_seekable(a)",paVar5);
  verify_large_zip(paVar5,fileblocks);
  iVar3 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƃ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar5 = archive_read_new();
  wVar4 = archive_read_support_format_zip_streamable(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɗ',0,"ARCHIVE_OK",(long)wVar4,
                      "archive_read_support_format_zip_streamable(a)",paVar5);
  verify_large_zip(paVar5,fileblocks);
  iVar3 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƌ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar5 = (archive *)0x200;
  pvVar8 = malloc(0x200);
  pfVar1 = fileblocks->first;
  fileblocks->current = pfVar1;
  fileblocks->fileposition = 0;
  if (pfVar1 != (fileblock *)0x0) {
    fileblocks->buff = pfVar1->buff;
    fileblocks->gap_remaining = pfVar1->gap_size;
  }
  memory_read_seek(paVar5,fileblocks,-0x200,2);
  __n = memory_read(paVar5,fileblocks,&local_88);
  if (__n == 0) {
    v1 = 0;
  }
  else {
    v1 = 0;
    do {
      paVar5 = (archive *)((long)pvVar8 + v1);
      memcpy(paVar5,local_88,__n);
      v1 = v1 + __n;
      __n = memory_read(paVar5,fileblocks,&local_88);
    } while (__n != 0);
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƛ',v1,"buffsize",0x200,"FINAL_SIZE",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ơ',(void *)((long)pvVar8 + v1 + -0x2a),"p - 42","PK\x06\a",
                      "\"PK\\006\\007\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƣ',(void *)((long)pvVar8 + v1 + -0x1a),"p - 26","\x01",
                      "\"\\001\\0\\0\\0\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʀ',(void *)((long)pvVar8 + v1 + -0x16),"p - 22","PK\x05\x06",
                      "\"PK\\005\\006\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƨ',(void *)((long)pvVar8 + v1 + -0xe),"p - 14","\x11",
                      "\"\\021\\0\\021\\0\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƭ',(void *)((long)pvVar8 + v1 + -6),"p - 6",anon_var_dwarf_fa764,
                      "\"\\xff\\xff\\xff\\xff\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ư',(void *)((long)pvVar8 + v1 + -2),"p - 2","","\"\\0\\0\"",2,"2",
                      (void *)0x0);
  while (pfVar1 = fileblocks->first, pfVar1 != (fileblock *)0x0) {
    fileblocks->first = pfVar1->next;
    free(pfVar1->buff);
    free(pfVar1);
  }
  free(fileblocks);
  free(nulldata);
  return;
}

Assistant:

static struct fileblocks *
fileblocks_new(void)
{
	struct fileblocks *fileblocks;

	fileblocks = calloc(1, sizeof(struct fileblocks));
	return fileblocks;
}